

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O1

void __thiscall rw::MatFX::setBumpTexture(MatFX *this,Texture *t)

{
  Texture *this_00;
  int i;
  ulong uVar1;
  MatFX *pMVar2;
  Texture **ppTVar3;
  
  uVar1 = 0;
  pMVar2 = this;
  do {
    if (pMVar2->fx[0].type == 1) goto LAB_0012f2e5;
    uVar1 = uVar1 + 1;
    pMVar2 = (MatFX *)(pMVar2->fx + 1);
  } while (uVar1 == 1);
  uVar1 = 0xffffffff;
LAB_0012f2e5:
  if (-1 < (int)uVar1) {
    ppTVar3 = &this->fx[uVar1 & 0xffffffff].field_1.bump.tex;
    this_00 = *ppTVar3;
    if (this_00 != (Texture *)0x0) {
      Texture::destroy(this_00);
    }
    *ppTVar3 = t;
    if (t != (Texture *)0x0) {
      t->refCount = t->refCount + 1;
    }
  }
  return;
}

Assistant:

void
MatFX::setBumpTexture(Texture *t)
{
	int32 i = this->getEffectIndex(BUMPMAP);
	if(i >= 0){
		if(this->fx[i].bump.tex)
			this->fx[i].bump.tex->destroy();
		this->fx[i].bump.tex = t;
		if(t)
			t->addRef();
	}
}